

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDar.c
# Opt level: O0

Abc_Ntk_t *
Abc_NtkDarFraig(Abc_Ntk_t *pNtk,int nConfLimit,int fDoSparse,int fProve,int fTransfer,int fSpeculate
               ,int fChoicing,int fVerbose)

{
  Aig_Man_t *pManAig;
  Aig_Man_t *pMan_00;
  Aig_Man_t *pTemp;
  Aig_Man_t *pMan;
  Abc_Ntk_t *pNtkAig;
  Fra_Par_t *pPars;
  Fra_Par_t Pars;
  int fSpeculate_local;
  int fTransfer_local;
  int fProve_local;
  int fDoSparse_local;
  int nConfLimit_local;
  Abc_Ntk_t *pNtk_local;
  
  Pars._116_4_ = fSpeculate;
  pManAig = Abc_NtkToDar(pNtk,0,0);
  if (pManAig == (Aig_Man_t *)0x0) {
    pNtk_local = (Abc_Ntk_t *)0x0;
  }
  else {
    Fra_ParamsDefault((Fra_Par_t *)&pPars);
    Pars.dActConeBumpMax._0_4_ = fChoicing;
    Pars.dActConeBumpMax._4_4_ = Pars._116_4_;
    Pars.fSpeculate = fVerbose;
    Pars.fChoicing = fProve;
    Pars.fProve = fDoSparse;
    Pars.fDoSparse = nConfLimit;
    pMan_00 = Fra_FraigPerform(pManAig,(Fra_Par_t *)&pPars);
    if (fChoicing == 0) {
      pMan = (Aig_Man_t *)Abc_NtkFromDar(pNtk,pMan_00);
    }
    else {
      pMan = (Aig_Man_t *)Abc_NtkFromDarChoices(pNtk,pMan_00);
    }
    Aig_ManStop(pManAig);
    Aig_ManStop(pMan_00);
    pNtk_local = (Abc_Ntk_t *)pMan;
  }
  return pNtk_local;
}

Assistant:

Abc_Ntk_t * Abc_NtkDarFraig( Abc_Ntk_t * pNtk, int nConfLimit, int fDoSparse, int fProve, int fTransfer, int fSpeculate, int fChoicing, int fVerbose )
{
    Fra_Par_t Pars, * pPars = &Pars; 
    Abc_Ntk_t * pNtkAig;
    Aig_Man_t * pMan, * pTemp;
    pMan = Abc_NtkToDar( pNtk, 0, 0 );
    if ( pMan == NULL )
        return NULL;
    Fra_ParamsDefault( pPars );
    pPars->nBTLimitNode = nConfLimit;
    pPars->fChoicing    = fChoicing;
    pPars->fDoSparse    = fDoSparse;
    pPars->fSpeculate   = fSpeculate;
    pPars->fProve       = fProve;
    pPars->fVerbose     = fVerbose;
    pMan = Fra_FraigPerform( pTemp = pMan, pPars );
    if ( fChoicing )
        pNtkAig = Abc_NtkFromDarChoices( pNtk, pMan );
    else
        pNtkAig = Abc_NtkFromDar( pNtk, pMan );
    Aig_ManStop( pTemp );
    Aig_ManStop( pMan );
    return pNtkAig;
}